

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

void __thiscall
slang::parsing::Parser::checkEmptyBody
          (Parser *this,SyntaxNode *syntax,Token prevToken,string_view syntaxName)

{
  string_view arg;
  bool bVar1;
  EmptyStatementSyntax *pEVar2;
  char *in_RDX;
  SyntaxNode *in_RSI;
  Diagnostic *in_R8;
  Token *in_R9;
  ParserBase *unaff_retaddr;
  SourceLocation in_stack_00000008;
  DiagCode in_stack_00000014;
  EmptyStatementSyntax *ess;
  
  if ((((in_RSI->kind == EmptyStatement) &&
       (bVar1 = Token::isMissing((Token *)&stack0xfffffffffffffff0), !bVar1)) &&
      (pEVar2 = slang::syntax::SyntaxNode::as<slang::syntax::EmptyStatementSyntax>(in_RSI),
      (pEVar2->super_StatementSyntax).label == (NamedLabelSyntax *)0x0)) &&
     (((bVar1 = std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                          ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *
                           )0x33f47b), bVar1 &&
       (bVar1 = Token::isMissing(&pEVar2->semicolon), !bVar1)) &&
      (bVar1 = Token::isOnSameLine(in_R9), bVar1)))) {
    Token::location(&pEVar2->semicolon);
    ParserBase::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
    arg._M_str = in_RDX;
    arg._M_len = (size_t)in_R9;
    Diagnostic::operator<<(in_R8,arg);
  }
  return;
}

Assistant:

void Parser::checkEmptyBody(const SyntaxNode& syntax, Token prevToken,
                            std::string_view syntaxName) {
    if (syntax.kind != SyntaxKind::EmptyStatement || prevToken.isMissing())
        return;

    auto& ess = syntax.as<EmptyStatementSyntax>();
    if (ess.label || !ess.attributes.empty() || ess.semicolon.isMissing() ||
        !ess.semicolon.isOnSameLine()) {
        return;
    }

    addDiag(diag::EmptyBody, ess.semicolon.location()) << syntaxName;
}